

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_date_numberlong(void)

{
  test_bson_json_date_check("{ \"dt\" : { \"$date\" : {\"$numberLong\": \"0\" } } }",0);
  test_bson_json_date_check
            ("{ \"dt\" : { \"$date\" : {\"$numberLong\": \"1356351330500\" } } }",0x13bccd6d8c4);
  test_bson_json_date_check
            ("{ \"dt\" : { \"$date\" : { \"$numberLong\" : \"-62135593139000\" } } }",
             -0x388311f4fb38);
  test_bson_json_date_check
            ("{ \"dt\" : { \"$date\" : { \"$numberLong\" : \"9223372036854775807\" } } }",
             0x7fffffffffffffff);
  test_bson_json_date_check
            ("{ \"dt\" : { \"$date\" : { \"$numberLong\" : \"-9223372036854775808\" } } }",
             -0x8000000000000000);
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : { \"$numberLong\" : \"9223372036854775808\" } } }",
             "Number \"9223372036854775808\" is out of range");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : { \"$numberLong\" : \"-9223372036854775809\" } } }",
             "Number \"-9223372036854775809\" is out of range");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : { \"$numberLong\" : \"10000000000000000000\" } } }",
             "Number \"10000000000000000000\" is out of range");
  test_bson_json_date_error
            ("{ \"dt\" : { \"$date\" : { \"$numberLong\" : \"-10000000000000000000\" } } }",
             "Number \"-10000000000000000000\" is out of range");
  return;
}

Assistant:

static void
test_bson_json_date_numberlong (void)
{
   test_bson_json_date_check (
      "{ \"dt\" : { \"$date\" : {\"$numberLong\": \"0\" } } }", 0);
   test_bson_json_date_check (
      "{ \"dt\" : { \"$date\" : {\"$numberLong\": \"1356351330500\" } } }",
      1356351330500);
   test_bson_json_date_check (
      "{ \"dt\" : { \"$date\" : { \"$numberLong\" : \"-62135593139000\" } } }",
      -62135593139000);

   /* INT64_MAX */
   test_bson_json_date_check ("{ \"dt\" : { \"$date\" : { \"$numberLong\" "
                              ": \"9223372036854775807\" } } }",
                              INT64_MAX);

   /* INT64_MIN */
   test_bson_json_date_check ("{ \"dt\" : { \"$date\" : { \"$numberLong\" "
                              ": \"-9223372036854775808\" } } }",
                              INT64_MIN);

   /* INT64_MAX + 1 */
   test_bson_json_date_error ("{ \"dt\" : { \"$date\" : { \"$numberLong\" "
                              ": \"9223372036854775808\" } } }",
                              "Number \"9223372036854775808\" is out of range");

   /* INT64_MIN - 1 */
   test_bson_json_date_error (
      "{ \"dt\" : { \"$date\" : { \"$numberLong\" "
      ": \"-9223372036854775809\" } } }",
      "Number \"-9223372036854775809\" is out of range");

   test_bson_json_date_error (
      "{ \"dt\" : { \"$date\" : { \"$numberLong\" "
      ": \"10000000000000000000\" } } }",
      "Number \"10000000000000000000\" is out of range");

   test_bson_json_date_error (
      "{ \"dt\" : { \"$date\" : { \"$numberLong\" "
      ": \"-10000000000000000000\" } } }",
      "Number \"-10000000000000000000\" is out of range");
}